

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

double opengv::relative_pose::modules::fivept_nister::polyVal(MatrixXd *p,double x)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [64];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  lVar1 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar1 == 0) {
    dVar4 = 0.0;
  }
  else {
    auVar5 = ZEXT816(0);
    lVar2 = 0;
    do {
      auVar6._0_8_ = auVar5._0_8_;
      dVar4 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
              [(lVar2 >> 0x20) *
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows];
      lVar1 = lVar1 + -1;
      auVar3._0_8_ = pow(x,(double)(int)lVar1);
      auVar3._8_56_ = extraout_var;
      auVar6._8_8_ = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar4;
      auVar5 = vfmadd231sd_fma(auVar6,auVar3._0_16_,auVar5);
      dVar4 = auVar5._0_8_;
      lVar2 = lVar2 + 0x100000000;
    } while (lVar1 != 0);
  }
  return dVar4;
}

Assistant:

PollishCoefficientsFunctor( const Eigen::Matrix<double,10,20> & A ) :
      OptimizationFunctor<double>(3,10),
      _A(A) {}